

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O3

uint64_t SS_AwareHash(uchar *data,uint64_t n,uint64_t hash,uint64_t scale,uint64_t hardener)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uchar uVar4;
  
  uVar3 = n * 2;
  if (uVar3 != 0) {
    uVar4 = '\0';
    do {
      if ((uVar3 & 1) == 0) {
        uVar4 = *data;
        data = data + 1;
      }
      iVar2 = ((uint)uVar3 & 1) << 2;
      uVar1 = (int)(char)uVar4 >> iVar2;
      hash = hash * scale +
             (long)(short)((int)((uint)(ushort)((short)uVar1 >> 0xf) << 0x10 | uVar1 & 0xffff) %
                          (int)(short)(0x10 << iVar2));
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return hash ^ hardener;
}

Assistant:

uint64_t SS_AwareHash(unsigned char* data, uint64_t n,
	uint64_t hash, uint64_t scale, uint64_t hardener) {
	n = 2 * n;
	char tmp = 0;
	while (n) {
		hash *= scale;
		if (n % 2 == 0)
			tmp = *data++;
		hash += (tmp >> (n % 2) * 4) % (1 << (n % 2 + 1) * 4);
		n--;
	}
	return hash ^ hardener;
}